

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnusedSensitiveSignal.cpp
# Opt level: O2

void __thiscall
unused_sensitive_signal::MainVisitor::handle(MainVisitor *this,ProceduralBlockSymbol *block)

{
  pointer ppVar1;
  bool bVar2;
  Statement *pSVar3;
  Diagnostic *this_00;
  pointer ppVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view sVar5;
  CollectAllIdentifiers timingIdVisitor;
  CollectAllIdentifiers stmtIdVisitor;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> signal;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
  unusedSignals;
  allocator<char> local_c9;
  _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
  local_c8;
  _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
  local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  SourceLocation local_78;
  _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar5 = slang::SourceManager::getFileName(*(SourceManager **)this,(block->super_Symbol).location);
  bVar2 = TidyVisitor::skip((TidyVisitor *)this,sVar5);
  if ((!bVar2) && ((block->procedureKind == AlwaysFF || (block->procedureKind == Always)))) {
    pSVar3 = slang::ast::ProceduralBlockSymbol::getBody(block);
    if (pSVar3->kind == Timed) {
      pSVar3 = slang::ast::ProceduralBlockSymbol::getBody(block);
      if (((pSVar3[1].syntax)->super_SyntaxNode).kind == SeparatedList) {
        local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pSVar3 = slang::ast::ProceduralBlockSymbol::getBody(block);
        slang::ast::BlockStatement::
        visitStmts<unused_sensitive_signal::MainVisitor::CollectAllIdentifiers&>
                  ((BlockStatement *)pSVar3[1].syntax,(CollectAllIdentifiers *)&local_a8);
        pSVar3 = slang::ast::ProceduralBlockSymbol::getBody(block);
        slang::ast::TimingControl::
        visit<unused_sensitive_signal::MainVisitor::CollectAllIdentifiers>
                  (*(TimingControl **)(pSVar3 + 1),(CollectAllIdentifiers *)&local_c8);
        std::
        __sort<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,__gnu_cxx::__ops::_Iter_comp_iter<unused_sensitive_signal::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (local_c8._M_impl.super__Vector_impl_data._M_start,
                   local_c8._M_impl.super__Vector_impl_data._M_finish);
        std::
        __sort<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,__gnu_cxx::__ops::_Iter_comp_iter<unused_sensitive_signal::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (local_a8._M_impl.super__Vector_impl_data._M_start,
                   local_a8._M_impl.super__Vector_impl_data._M_finish);
        local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        __set_difference<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,std::back_insert_iterator<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,__gnu_cxx::__ops::_Iter_comp_iter<unused_sensitive_signal::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (local_c8._M_impl.super__Vector_impl_data._M_start,
                   local_c8._M_impl.super__Vector_impl_data._M_finish,
                   local_a8._M_impl.super__Vector_impl_data._M_start,
                   local_a8._M_impl.super__Vector_impl_data._M_finish);
        ppVar1 = local_68._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar4 = local_68._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1;
            ppVar4 = ppVar4 + 1) {
          local_88._M_len = (ppVar4->first)._M_len;
          local_88._M_str = (ppVar4->first)._M_str;
          local_78 = *(SourceLocation *)&(ppVar4->second).field_0x0;
          __y._M_str = (char *)**(undefined8 **)(this + 0x10);
          __y._M_len = (*(undefined8 **)(this + 0x10))[1];
          bVar2 = std::operator==(ppVar4->first,__y);
          if (!bVar2) {
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)&local_50,&local_88,&local_c9);
            bVar2 = std::
                    regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                              (&local_50,
                               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                               (*(long *)(this + 0x10) + 0x40),0);
            std::__cxx11::string::~string((string *)&local_50);
            if (!bVar2) {
              this_00 = slang::Diagnostics::add
                                  (*(Diagnostics **)(this + 8),(DiagCode)0x120010,local_78);
              sVar5._M_str = local_88._M_str;
              sVar5._M_len = local_88._M_len;
              slang::Diagnostic::operator<<(this_00,sVar5);
            }
          }
        }
        std::
        _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
        ::~_Vector_base(&local_68);
        std::
        _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
        ::~_Vector_base(&local_c8);
        std::
        _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
        ::~_Vector_base(&local_a8);
      }
    }
  }
  return;
}

Assistant:

void handle(const ProceduralBlockSymbol& block) {
        NEEDS_SKIP_SYMBOL(block)

        if (block.procedureKind != ProceduralBlockKind::AlwaysFF &&
            block.procedureKind != ProceduralBlockKind::Always)
            return;

        if (block.getBody().kind != StatementKind::Timed ||
            block.getBody().as<TimedStatement>().stmt.kind != StatementKind::Block)
            return;

        CollectAllIdentifiers stmtIdVisitor, timingIdVisitor;
        block.getBody().as<TimedStatement>().stmt.as<BlockStatement>().visitStmts(stmtIdVisitor);
        block.getBody().as<TimedStatement>().timing.visit(timingIdVisitor);

        auto compare = [](const auto& a, const auto& b) { return a.first < b.first; };

        std::sort(timingIdVisitor.identifiers.begin(), timingIdVisitor.identifiers.end(), compare);
        std::sort(stmtIdVisitor.identifiers.begin(), stmtIdVisitor.identifiers.end(), compare);

        std::vector<std::pair<std::string_view, SourceLocation>> unusedSignals;

        std::set_difference(timingIdVisitor.identifiers.begin(), timingIdVisitor.identifiers.end(),
                            stmtIdVisitor.identifiers.begin(), stmtIdVisitor.identifiers.end(),
                            std::back_inserter(unusedSignals), compare);

        for (auto signal : unusedSignals) {
            // either match against clkName or against the regex pattern
            if (signal.first != config.getCheckConfigs().clkName &&
                !(std::regex_match(std::string(signal.first),
                                   config.getCheckConfigs().clkNameRegexPattern)))
                diags.add(diag::UnusedSensitiveSignal, signal.second) << signal.first;
        }
    }